

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pointgrid.cpp
# Opt level: O0

bool __thiscall
ON_PointGrid::GetTightBoundingBox
          (ON_PointGrid *this,ON_BoundingBox *tight_bbox,bool bGrowBox,ON_Xform *xform)

{
  int count;
  bool bVar1;
  ON_3dPoint *points;
  int local_2c;
  int i;
  ON_Xform *xform_local;
  bool bGrowBox_local;
  ON_BoundingBox *tight_bbox_local;
  ON_PointGrid *this_local;
  
  xform_local._7_1_ = bGrowBox;
  if ((bGrowBox) && (bVar1 = ON_BoundingBox::IsValid(tight_bbox), !bVar1)) {
    xform_local._7_1_ = 0;
  }
  if ((xform_local._7_1_ & 1) == 0) {
    ON_BoundingBox::Destroy(tight_bbox);
  }
  for (local_2c = 0; local_2c < this->m_point_count[0]; local_2c = local_2c + 1) {
    count = this->m_point_count[1];
    points = ON_SimpleArray<ON_3dPoint>::operator[]
                       (&(this->m_point).super_ON_SimpleArray<ON_3dPoint>,local_2c);
    bVar1 = ON_GetPointListBoundingBox
                      (3,false,count,3,&points->x,tight_bbox,(uint)(xform_local._7_1_ & 1),xform);
    if (bVar1) {
      xform_local._7_1_ = 1;
    }
  }
  return (bool)(-(xform_local._7_1_ & 1) & 1);
}

Assistant:

bool ON_PointGrid::GetTightBoundingBox(
         ON_BoundingBox& tight_bbox,
         bool bGrowBox,
				 const ON_Xform* xform 
         ) const
{
  if ( bGrowBox && !tight_bbox.IsValid() )
  {
    bGrowBox = false;
  }
  if ( !bGrowBox )
  {
    tight_bbox.Destroy();
  }
  
  int i;
  for ( i = 0; i < m_point_count[0]; i++ )
  {
    if ( ON_GetPointListBoundingBox( 3, 0, m_point_count[1], 3, &m_point[i].x, tight_bbox, bGrowBox, xform ) )
      bGrowBox = true;
  }
  return bGrowBox?true:false;
}